

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int fm_write(chmgr *chmgr,uint8_t fn,void *payload,uint16_t len)

{
  uint16_t __v;
  uint16_t uVar1;
  uint8_t *payload_00;
  undefined2 in_register_0000000a;
  uint uVar2;
  
  uVar2 = CONCAT22(in_register_0000000a,len);
  payload_00 = (uint8_t *)malloc((ulong)(uVar2 + 5));
  *payload_00 = fn;
  *(uint16_t *)(payload_00 + 1) = len;
  memcpy(payload_00 + 3,payload,(ulong)uVar2);
  uVar1 = calc_crc(payload_00,len + 3);
  *(uint16_t *)(payload_00 + (ulong)uVar2 + 3) = uVar1;
  slip_encode(chmgr->slip,payload_00,(uint16_t)(uVar2 + 5));
  return uVar2;
}

Assistant:

int fm_write(struct chmgr *chmgr, uint8_t fn, const void *payload, uint16_t len)
{
    uint16_t crc;
    uint8_t *fm = (uint8_t*)malloc(FM_HDR_SIZE + len + 2);

    fm[0] = fn;
    U16_TO_STREAM(fm + 1, len);
    memcpy(fm + 3, payload, len);
    crc = calc_crc(fm, FM_HDR_SIZE + len);
    U16_TO_STREAM(fm + FM_HDR_SIZE + len, crc);
    slip_encode(chmgr->slip, fm, FM_HDR_SIZE + len + 2);
    return len;
}